

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryCamera(AssbinImporter *this,IOStream *stream,aiCamera *cam)

{
  uint uVar1;
  DeadlyImportError *this_00;
  float fVar2;
  aiVector3D aVar3;
  undefined8 local_4b8;
  float local_4b0;
  undefined8 local_498;
  float local_490;
  undefined8 local_478;
  float local_470;
  aiString local_45c;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  aiCamera *local_20;
  aiCamera *cam_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = cam;
  cam_local = (aiCamera *)stream;
  stream_local = (IOStream *)this;
  uVar1 = Read<unsigned_int>(stream);
  if (uVar1 != 0x1234) {
    local_55 = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41)
    ;
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    local_55 = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  Read<unsigned_int>((IOStream *)cam_local);
  Read<aiString>(&local_45c,(IOStream *)cam_local);
  aiString::operator=(&local_20->mName,&local_45c);
  aVar3 = Read<aiVector3t<float>>((IOStream *)cam_local);
  local_470 = aVar3.z;
  local_478 = aVar3._0_8_;
  (local_20->mPosition).z = local_470;
  (local_20->mPosition).x = (float)(undefined4)local_478;
  (local_20->mPosition).y = (float)local_478._4_4_;
  aVar3 = Read<aiVector3t<float>>((IOStream *)cam_local);
  local_490 = aVar3.z;
  local_498 = aVar3._0_8_;
  (local_20->mLookAt).z = local_490;
  (local_20->mLookAt).x = (float)(undefined4)local_498;
  (local_20->mLookAt).y = (float)local_498._4_4_;
  aVar3 = Read<aiVector3t<float>>((IOStream *)cam_local);
  local_4b8 = aVar3._0_8_;
  local_4b0 = aVar3.z;
  (local_20->mUp).x = (float)(undefined4)local_4b8;
  (local_20->mUp).y = (float)local_4b8._4_4_;
  (local_20->mUp).z = local_4b0;
  fVar2 = Read<float>((IOStream *)cam_local);
  local_20->mHorizontalFOV = fVar2;
  fVar2 = Read<float>((IOStream *)cam_local);
  local_20->mClipPlaneNear = fVar2;
  fVar2 = Read<float>((IOStream *)cam_local);
  local_20->mClipPlaneFar = fVar2;
  fVar2 = Read<float>((IOStream *)cam_local);
  local_20->mAspect = fVar2;
  return;
}

Assistant:

void AssbinImporter::ReadBinaryCamera( IOStream * stream, aiCamera* cam ) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AICAMERA)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    cam->mName = Read<aiString>(stream);
    cam->mPosition = Read<aiVector3D>(stream);
    cam->mLookAt = Read<aiVector3D>(stream);
    cam->mUp = Read<aiVector3D>(stream);
    cam->mHorizontalFOV = Read<float>(stream);
    cam->mClipPlaneNear = Read<float>(stream);
    cam->mClipPlaneFar = Read<float>(stream);
    cam->mAspect = Read<float>(stream);
}